

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall
QDateTimeEdit::QDateTimeEdit(QDateTimeEdit *this,QVariant *var,Type parserType,QWidget *parent)

{
  QDateTimeEditPrivate *pQVar1;
  long in_FS_OFFSET;
  Data local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QDateTimeEditPrivate *)operator_new(0x510);
  local_40.d = (QTimeZonePrivate *)((ulong)(parserType != QDateTime) + 1);
  QDateTimeEditPrivate::QDateTimeEditPrivate(pQVar1,(QTimeZone *)&local_40.s);
  QAbstractSpinBox::QAbstractSpinBox
            ((QAbstractSpinBox *)this,(QAbstractSpinBoxPrivate *)pQVar1,parent);
  QTimeZone::~QTimeZone((QTimeZone *)&local_40.s);
  *(undefined ***)&(this->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_007cae28;
  *(undefined ***)&(this->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QDateTimeEdit_007cb018;
  pQVar1 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  *(Type *)&pQVar1->field_0x458 = parserType;
  QDateTimeEditPrivate::init(pQVar1,(EVP_PKEY_CTX *)var);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeEdit::QDateTimeEdit(const QVariant &var, QMetaType::Type parserType, QWidget *parent)
    : QAbstractSpinBox(*new QDateTimeEditPrivate(parserType == QMetaType::QDateTime
                                                 ? QTimeZone::LocalTime : QTimeZone::UTC),
                       parent)
{
    Q_D(QDateTimeEdit);
    d->parserType = parserType;
    d->init(var);
}